

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  path *ppVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer ppVar7;
  pointer ppVar8;
  bool bVar9;
  path *ppVar10;
  basic_ostream<char,_std::char_traits<char>_> *pbVar11;
  long lVar12;
  ostream *poVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  path *d;
  double *pdVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vector<double,_std::allocator<double>_> v;
  recursive_directory_iterator __end1;
  string output_dir;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> data_files
  ;
  vector<double,_std::allocator<double>_> v2;
  string mkdir_command;
  ofstream output_file;
  ifstream f;
  double local_568;
  double local_560;
  vector<double,_std::allocator<double>_> local_558;
  double local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  double local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_4e8;
  vector<double,_std::allocator<double>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  double local_498;
  recursive_directory_iterator local_490;
  recursive_directory_iterator local_480;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_470;
  istream_iterator<double,_char,_std::char_traits<char>,_long> local_458;
  undefined1 local_438 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  ios_base local_340 [264];
  path local_238 [13];
  
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438 = (undefined1  [8])getenv("HOME");
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (local_238,(char **)local_438,auto_format);
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&local_508,local_238,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(local_238);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
    }
  }
  local_4b8._M_dataplus._M_p = local_508._M_dataplus._M_p;
  local_4b8._M_string_length = local_508._M_string_length;
  local_480._M_dirs._M_ptr = (element_type *)0x0;
  local_480._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_480);
  local_490._M_dirs._M_ptr = (element_type *)local_508._M_dataplus._M_p;
  local_490._M_dirs._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_508._M_string_length + 8) = *(int *)(local_508._M_string_length + 8) + 1;
    }
  }
  local_538._M_dataplus._M_p = (pointer)0x0;
  local_538._M_string_length = 0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_490);
  paVar1 = &local_238[0]._M_pathname.field_2;
  while (local_4b8._M_string_length != local_538._M_string_length) {
    ppVar10 = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                                ((recursive_directory_iterator *)&local_4b8);
    pcVar2 = (ppVar10->_M_pathname)._M_dataplus._M_p;
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,pcVar2,pcVar2 + (ppVar10->_M_pathname)._M_string_length);
    local_438 = (undefined1  [8])local_238[0]._M_pathname._M_string_length;
    local_430 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0]._M_pathname._M_dataplus._M_p;
    bVar9 = std::basic_string_view<char,_std::char_traits<char>_>::ends_with
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_438,
                       "_rse_workshop.dat");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_238[0]._M_pathname._M_dataplus._M_p,
                      local_238[0]._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar9) {
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                  *)&local_4e8,ppVar10);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)&local_4b8);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_538);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_4b8);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
            ((recursive_directory_iterator *)&local_508);
  ppVar8 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar10 = local_4e8.
            super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = local_4e8.
           super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar15 = ((long)local_4e8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_4e8.
                    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar12 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::path*,std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar7,ppVar8);
    ppVar10 = local_4e8.
              super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = local_4e8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppVar7 = local_4e8.
                  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      ppVar10 !=
      local_4e8.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppVar10 = ppVar10 + 1) {
    local_4e8.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
    pbVar11 = std::filesystem::__cxx11::operator<<
                        ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,ppVar10);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar11 + -0x18) + (char)pbVar11);
    std::ostream::put((char)pbVar11);
    std::ostream::flush();
    ppVar3 = local_4e8.
             super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_4e8.
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
  }
  local_4e8.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
  std::ifstream::ifstream
            (local_238,
             ((local_4e8.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_pathname)._M_dataplus._M_p,_S_in);
  local_470._M_ok = true;
  local_470._M_stream = (istream_type *)local_238;
  std::istream_iterator<double,_char,_std::char_traits<char>,_long>::_M_read(&local_470);
  local_458._M_stream = (istream_type *)0x0;
  local_458._M_value = 0.0;
  local_458._M_ok = false;
  std::vector<double,std::allocator<double>>::
  vector<std::istream_iterator<double,char,std::char_traits<char>,long>,void>
            ((vector<double,std::allocator<double>> *)&local_558,&local_470,&local_458,
             (allocator_type *)local_438);
  local_540 = std::
              reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>>
                        (0,local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start,
                         local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
  lVar12 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  auVar23._8_4_ =
       (int)((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 0x23);
  auVar23._0_8_ = lVar12;
  auVar23._12_4_ = 0x45300000;
  local_540 = local_540 /
              ((auVar23._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
  dVar18 = std::
           transform_reduce<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,std::plus<void>,std::multiplies<void>>
                     (0,local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                      local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  lVar12 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  auVar21._8_4_ =
       (int)((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 0x23);
  auVar21._0_8_ = lVar12;
  auVar21._12_4_ = 0x45300000;
  dVar18 = dVar18 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) -
           local_540 * local_540;
  if (dVar18 < 0.0) {
    dVar19 = sqrt(dVar18);
  }
  else {
    dVar19 = SQRT(dVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mean:   ",8);
  poVar13 = std::ostream::_M_insert<double>(local_540);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"var:    ",8);
  poVar13 = std::ostream::_M_insert<double>(dVar18);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,1);
  pdVar5 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar18 = 0.0;
  pdVar17 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar12 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start; 0x18 < lVar12; lVar12 = lVar12 + -0x20) {
    local_510 = pow((*pdVar17 - local_540) / dVar19,3.0);
    dVar20 = pow((pdVar17[1] - local_540) / dVar19,3.0);
    local_510 = dVar20 + local_510;
    local_498 = pow((pdVar17[2] - local_540) / dVar19,3.0);
    dVar20 = pow((pdVar17[3] - local_540) / dVar19,3.0);
    dVar18 = dVar18 + dVar20 + local_498 + local_510;
    pdVar17 = pdVar17 + 4;
  }
  for (; pdVar6 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      pdVar4 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start, pdVar17 != pdVar5; pdVar17 = pdVar17 + 1) {
    dVar20 = pow((*pdVar17 - local_540) / dVar19,3.0);
    dVar18 = dVar18 + dVar20;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"skew:   ",8);
  lVar12 = (long)pdVar6 - (long)pdVar4 >> 3;
  auVar22._8_4_ = (int)((long)pdVar6 - (long)pdVar4 >> 0x23);
  auVar22._0_8_ = lVar12;
  auVar22._12_4_ = 0x45300000;
  poVar13 = std::ostream::_M_insert<double>
                      (dVar18 / ((auVar22._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)));
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,1);
  lVar12 = std::chrono::_V2::system_clock::now();
  std::vector<double,_std::allocator<double>_>::vector(&local_4d0,&local_558);
  pdVar4 = local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar15 = (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar14 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar5,pdVar4);
  }
  dVar18 = local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start
           [(int)((ulong)((long)local_4d0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 4)];
  lVar14 = std::chrono::_V2::system_clock::now();
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median took ",0xc);
  poVar13 = std::ostream::_M_insert<double>((double)(lVar14 - lVar12) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"median: ",8);
  poVar13 = std::ostream::_M_insert<double>(dVar18);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,1);
  if ((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar12 = (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    lVar14 = 0;
    do {
      lVar14 = lVar14 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != lVar14);
  }
  *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) =
       *(uint *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Any greater than 50? ",0x15);
  poVar13 = std::ostream::_M_insert<bool>(true);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,1);
  iVar16 = 0;
  lVar12 = 0;
  do {
    local_568 = dVar18;
    local_560 = dVar19 + dVar19;
    if (((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) + -1 == lVar12) goto LAB_00103117;
    lVar14 = lVar12 + 1;
    local_568 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12];
    local_560 = local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12 + 1];
    lVar12 = lVar14;
  } while (ABS(local_560 - local_568) <= dVar19 + dVar19);
  iVar16 = (int)lVar14 + -1;
LAB_00103117:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Position ",9);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", first ",8);
  poVar13 = std::ostream::_M_insert<double>(local_568);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," second: ",9);
  poVar13 = std::ostream::_M_insert<double>(local_560);
  local_438[0] = (allocator_type)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,local_438,1);
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"./output","");
  std::operator+(&local_4b8,"mkdir -p ",&local_508);
  system(local_4b8._M_dataplus._M_p);
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_538,local_508._M_dataplus._M_p,
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (local_508._M_string_length + (long)local_508._M_dataplus._M_p));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_538,"/results.dat");
  std::ofstream::ofstream(local_438,(string *)&local_538,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  std::ostream::_M_insert<double>
            (*local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  if (8 < (ulong)((long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    uVar15 = 1;
    do {
      local_538._M_dataplus._M_p._0_1_ = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,(char *)&local_538,1);
      std::ostream::_M_insert<double>
                (local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15]);
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)local_558.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_558.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ofstream::close();
  local_438 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_430);
  std::ios_base::~ios_base(local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if (local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&local_4e8);
  return 0;
}

Assistant:

int main()
{
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 1. Reading some data in from a file
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Find all files like *_rse_workshop.dat under a specific directory
    std::vector<fs::path> data_files;
    for (auto &p : fs::recursive_directory_iterator(std::getenv("HOME")))
    {
        if (p.path().string().ends_with("_rse_workshop.dat"))
        {
            data_files.emplace_back(p.path());
        }
    }

    // This is just to make sure the same file is first, so the numbers later are the same on each version.
    // The sort isn't necessary!
    std::sort(data_files.begin(), data_files.end());

    // Which data files did we find? (range-for loop)
    for (const auto &d : data_files)
    {
        std::cout << d << std::endl;
    }


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 2. Calculate the mean and standard deviation of some data
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Read some data in
    std::ifstream f(data_files[0]);
    std::vector<double> v{std::istream_iterator<double>(f), std::istream_iterator<double>()};

    const double mean = std::reduce(v.begin(), v.end(), 0.0) / v.size();
    const double var = std::transform_reduce(v.begin(), v.end(), v.begin(), 0.0) / v.size() - mean * mean;
    const double std = std::sqrt(var);

    std::cout << "mean:   " << mean << '\n';
    std::cout << "var:    " << var << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 3. Calculate the skewness - there's no default algorithm for that!
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Compute skewness
    auto third_moment = [mean, std](const double x) { return std::pow((x - mean) / std, 3); };
    const double skew = std::transform_reduce(v.begin(), v.end(), 0.0, std::plus<>(), third_moment) / v.size();

    std::cout << "skew:   " << skew << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 4. Calculate the median (and bonus chrono)
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    auto t1 = std::chrono::high_resolution_clock::now();

    // Take a copy of the vector so we can sort it
    std::vector<double> v2 = v;

    std::sort(v2.begin(), v2.end());
    int half_way = v2.size() / 2;
    const double median = v2[half_way];

    auto t2 = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double, std::milli> ms = t2 - t1;
    std::cout << std::fixed << "median took " << ms.count() << " ms\n";

    std::cout << "median: " << median << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 5. What other algorithms are there?
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    // Are any of the elements > 50?
    bool any_greater_than_50 = false;

    for (int i = 0; i < v.size(); i++)
    {
        if (v[i] > 50.0)
        {
            any_greater_than_50 = true;
        }
    }
    std::cout << std::boolalpha << "Any greater than 50? " << any_greater_than_50 << '\n';

    // First position where consecutive elements differ by more than twice the standard deviation
    int dist = 0;
    double first, second;
    for (int i = 0; i < v.size() - 1; i++)
    {
        if (std::fabs(v[i + 1] - v[i]) > 2 * std)
        {
            dist = i;
            first = v[i];
            second = v[i + 1];
            break;
        }
    }
    std::cout << "Position " << dist << ", first " << first << " second: " << second << '\n';


    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    /// 7. Writing some data back out to a csv file - pulling several concepts together
    ///////////////////////////////////////////////////////////////////////////////////////////////////////////////////

    std::string output_dir = "./output";
    std::string mkdir_command = "mkdir -p " + output_dir;
    // System takes a const char* as a parameter
    system(mkdir_command.c_str());

    // Create an output file
    std::ofstream output_file(output_dir + "/results.dat");
    output_file << v[0];
    for (int i = 1; i < v.size(); i++)
    {
        output_file << ',' << v[i];
    }
    output_file.close();
}